

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O0

bool S2::ClipEdgeBound(R2Point *a,R2Point *b,R2Rect *clip,R2Rect *bound)

{
  bool bVar1;
  uint diag_00;
  R1Interval *pRVar2;
  R1Interval *pRVar3;
  R1Interval *pRVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 local_2d;
  int diag;
  R2Rect *bound_local;
  R2Rect *clip_local;
  R2Point *b_local;
  R2Point *a_local;
  
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)a,0);
  dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)b,0);
  dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)a,1);
  dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)b,1);
  diag_00 = (uint)(dVar6 < dVar5 != dVar8 < dVar7);
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)a,0);
  dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)b,0);
  pRVar2 = R2Rect::operator[](bound,0);
  dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)a,1);
  dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)b,1);
  pRVar3 = R2Rect::operator[](bound,1);
  pRVar4 = R2Rect::operator[](clip,0);
  bVar1 = ClipBoundAxis(dVar5,dVar6,pRVar2,dVar7,dVar8,pRVar3,diag_00,pRVar4);
  local_2d = false;
  if (bVar1) {
    dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)a,1);
    dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)b,1);
    pRVar2 = R2Rect::operator[](bound,1);
    dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)a,0);
    dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                      ((BasicVector<Vector2,_double,_2UL> *)b,0);
    pRVar3 = R2Rect::operator[](bound,0);
    pRVar4 = R2Rect::operator[](clip,1);
    local_2d = ClipBoundAxis(dVar5,dVar6,pRVar2,dVar7,dVar8,pRVar3,diag_00,pRVar4);
  }
  return local_2d;
}

Assistant:

bool ClipEdgeBound(const R2Point& a, const R2Point& b, const R2Rect& clip,
                   R2Rect* bound) {
  // "diag" indicates which diagonal of the bounding box is spanned by AB: it
  // is 0 if AB has positive slope, and 1 if AB has negative slope.  This is
  // used to determine which interval endpoints need to be updated each time
  // the edge is clipped.
  int diag = (a[0] > b[0]) != (a[1] > b[1]);
  return (ClipBoundAxis(a[0], b[0], &(*bound)[0], a[1], b[1], &(*bound)[1],
                        diag, clip[0]) &&
          ClipBoundAxis(a[1], b[1], &(*bound)[1], a[0], b[0], &(*bound)[0],
                        diag, clip[1]));
}